

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testGroupEnded(XmlReporter *this,TestGroupStats *testGroupStats)

{
  XmlWriter *this_00;
  allocator<char> local_a4;
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  string local_30 [32];
  
  LazyStat<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentGroupInfo);
  std::__cxx11::string::string<std::allocator<char>>(local_30,"OverallResults",&local_a1);
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)local_a0,(string *)this_00,(XmlFormatting)local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"successes",&local_a2);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,&local_50,&(testGroupStats->totals).assertions.passed);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"failures",&local_a3);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,&local_70,&(testGroupStats->totals).assertions.failed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a0 + 0x10),"expectedFailures",&local_a4);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,(string *)(local_a0 + 0x10),
             &(testGroupStats->totals).assertions.failedButOk);
  std::__cxx11::string::~string((string *)(local_a0 + 0x10));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a0);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::string<std::allocator<char>>(local_30,"OverallResultsCases",&local_a1);
  XmlWriter::scopedElement((XmlWriter *)local_a0,(string *)this_00,(XmlFormatting)local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"successes",&local_a2);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,&local_50,&(testGroupStats->totals).testCases.passed);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"failures",&local_a3);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,&local_70,&(testGroupStats->totals).testCases.failed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a0 + 0x10),"expectedFailures",&local_a4);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,(string *)(local_a0 + 0x10),
             &(testGroupStats->totals).testCases.failedButOk);
  std::__cxx11::string::~string((string *)(local_a0 + 0x10));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a0);
  std::__cxx11::string::~string(local_30);
  XmlWriter::endElement(this_00,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::testGroupEnded( TestGroupStats const& testGroupStats ) {
        StreamingReporterBase::testGroupEnded( testGroupStats );
        // TODO: Check testGroupStats.aborting and act accordingly.
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testGroupStats.totals.assertions.passed )
            .writeAttribute( "failures", testGroupStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testGroupStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testGroupStats.totals.testCases.passed )
            .writeAttribute( "failures", testGroupStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testGroupStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }